

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

rcode __thiscall
olc::Renderer_OGL10::CreateDevice
          (Renderer_OGL10 *this,vector<void_*,_std::allocator<void_*>_> *params,bool bFullScreen,
          bool bVSYNC)

{
  pointer ppvVar1;
  Display *pDVar2;
  XVisualInfo *pXVar3;
  glDeviceContext_t p_Var4;
  XWindowAttributes gwa;
  undefined1 local_a0 [8];
  undefined4 local_98;
  undefined4 local_94;
  
  ppvVar1 = (params->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar2 = (Display *)*ppvVar1;
  this->olc_Display = pDVar2;
  this->olc_Window = (Window *)ppvVar1[1];
  pXVar3 = (XVisualInfo *)ppvVar1[2];
  this->olc_VisualInfo = pXVar3;
  p_Var4 = (glDeviceContext_t)glXCreateContext(pDVar2,pXVar3,0,1);
  this->glDeviceContext = p_Var4;
  glXMakeCurrent(this->olc_Display,*this->olc_Window,p_Var4);
  XGetWindowAttributes(this->olc_Display,*this->olc_Window,local_a0);
  glViewport(0,0,local_98,local_94);
  glSwapIntervalEXT = (glSwapInterval_t *)0x0;
  glSwapIntervalEXT = (glSwapInterval_t *)glXGetProcAddress("glXSwapIntervalEXT");
  if (glSwapIntervalEXT == (glSwapInterval_t *)0x0 && !bVSYNC) {
    puts("NOTE: Could not disable VSYNC, glXSwapIntervalEXT() was not found!");
    puts("      Don\'t worry though, things will still work, it\'s just the");
    puts("      frame rate will be capped to your monitors refresh rate - javidx9");
  }
  if (glSwapIntervalEXT != (glSwapInterval_t *)0x0 && !bVSYNC) {
    (*glSwapIntervalEXT)(this->olc_Display,*this->olc_Window,0);
  }
  glEnable(0xde1);
  glHint(0xc50,0x1102);
  return OK;
}

Assistant:

olc::rcode CreateDevice(std::vector<void *> params, bool bFullScreen, bool bVSYNC) override
		{
#if defined(OLC_PLATFORM_WINAPI)
			// Create Device Context
			glDeviceContext = GetDC((HWND)(params[0]));
			PIXELFORMATDESCRIPTOR pfd =
				{
					sizeof(PIXELFORMATDESCRIPTOR), 1,
					PFD_DRAW_TO_WINDOW | PFD_SUPPORT_OPENGL | PFD_DOUBLEBUFFER,
					PFD_TYPE_RGBA, 32, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
					PFD_MAIN_PLANE, 0, 0, 0, 0};

			int pf = 0;
			if (!(pf = ChoosePixelFormat(glDeviceContext, &pfd)))
				return olc::FAIL;
			SetPixelFormat(glDeviceContext, pf, &pfd);

			if (!(glRenderContext = wglCreateContext(glDeviceContext)))
				return olc::FAIL;
			wglMakeCurrent(glDeviceContext, glRenderContext);

			// Remove Frame cap
			wglSwapInterval = (wglSwapInterval_t *)wglGetProcAddress("wglSwapIntervalEXT");
			if (wglSwapInterval && !bVSYNC)
				wglSwapInterval(0);
			bSync = bVSYNC;
#endif

#if defined(OLC_PLATFORM_X11)
			using namespace X11;
			// Linux has tighter coupling between OpenGL and X11, so we store
			// various "platform" handles in the renderer
			olc_Display = (X11::Display *)(params[0]);
			olc_Window = (X11::Window *)(params[1]);
			olc_VisualInfo = (X11::XVisualInfo *)(params[2]);

			glDeviceContext = glXCreateContext(olc_Display, olc_VisualInfo, nullptr, GL_TRUE);
			glXMakeCurrent(olc_Display, *olc_Window, glDeviceContext);

			XWindowAttributes gwa;
			XGetWindowAttributes(olc_Display, *olc_Window, &gwa);
			glViewport(0, 0, gwa.width, gwa.height);

			glSwapIntervalEXT = nullptr;
			glSwapIntervalEXT = (glSwapInterval_t *)glXGetProcAddress((unsigned char *)"glXSwapIntervalEXT");

			if (glSwapIntervalEXT == nullptr && !bVSYNC)
			{
				printf("NOTE: Could not disable VSYNC, glXSwapIntervalEXT() was not found!\n");
				printf("      Don't worry though, things will still work, it's just the\n");
				printf("      frame rate will be capped to your monitors refresh rate - javidx9\n");
			}

			if (glSwapIntervalEXT != nullptr && !bVSYNC)
				glSwapIntervalEXT(olc_Display, *olc_Window, 0);
#endif

#if defined(OLC_PLATFORM_GLUT)
			mFullScreen = bFullScreen;
			if (!bVSYNC)
			{
#if defined(__APPLE__)
				GLint sync = 0;
				CGLContextObj ctx = CGLGetCurrentContext();
				if (ctx)
					CGLSetParameter(ctx, kCGLCPSwapInterval, &sync);
#endif
			}
#else
			glEnable(GL_TEXTURE_2D); // Turn on texturing
			glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);
#endif
			return olc::rcode::OK;
		}